

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sum_squares_sse2.c
# Opt level: O0

uint64_t aom_sum_sse_2d_i16_4xn_sse2(int16_t *src,int stride,int height,int *sum)

{
  uint64_t uVar1;
  undefined4 *in_RCX;
  int in_EDX;
  int curr_sum;
  uint64_t sse;
  int r;
  int *in_stack_00000058;
  int in_stack_00000064;
  int16_t *in_stack_00000068;
  undefined8 local_28;
  undefined4 local_1c;
  
  local_1c = 0;
  local_28 = 0;
  do {
    uVar1 = aom_sum_sse_2d_i16_4x4_sse2(in_stack_00000068,in_stack_00000064,in_stack_00000058);
    local_28 = uVar1 + local_28;
    *in_RCX = *in_RCX;
    local_1c = local_1c + 4;
  } while (local_1c < in_EDX);
  return local_28;
}

Assistant:

uint64_t aom_sum_sse_2d_i16_4xn_sse2(const int16_t *src, int stride, int height,
                                     int *sum) {
  int r = 0;
  uint64_t sse = 0;
  do {
    int curr_sum = 0;
    sse += aom_sum_sse_2d_i16_4x4_sse2(src, stride, &curr_sum);
    *sum += curr_sum;
    src += stride << 2;
    r += 4;
  } while (r < height);
  return sse;
}